

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

void Rml::Parse::Factor(DataParser *parser)

{
  pointer pcVar1;
  double value;
  int iVar2;
  ulong uVar3;
  long *plVar4;
  uint uVar5;
  bool *out_valid_function_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char cVar7;
  char cVar8;
  bool bVar9;
  bool valid_function_name;
  String str;
  String full_address;
  ProgramState backup_state;
  undefined1 local_a1;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  String local_78;
  String local_58;
  ProgramState local_38;
  
  if (parser->reached_end == false) {
    pcVar1 = (parser->expression)._M_dataplus._M_p;
    uVar3 = CONCAT71((int7)((ulong)pcVar1 >> 8),pcVar1[parser->index]);
  }
  else {
    uVar3 = 0;
  }
  out_valid_function_name = (bool *)(uVar3 & 0xff);
  uVar5 = (uint)out_valid_function_name;
  if (uVar5 < 0x28) {
    if (uVar5 == 0x21) {
      DataParser::Match(parser,'!',true);
      Factor(parser);
      Variant::Variant((Variant *)local_a0);
      DataParser::Emit(parser,Not,(Variant *)local_a0);
      Variant::~Variant((Variant *)local_a0);
      goto LAB_001f3e79;
    }
    if (uVar5 == 0x27) {
      cVar7 = '\0';
      DataParser::Match(parser,'\'',false);
      paVar6 = &local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      if (parser->reached_end == false) {
        cVar7 = (parser->expression)._M_dataplus._M_p[parser->index];
      }
      local_78._M_dataplus._M_p = (pointer)paVar6;
      if (cVar7 != '\0') {
        cVar8 = '\0';
        do {
          if (cVar8 != '\\' && cVar7 == '\'') break;
          bVar9 = cVar8 == '\\';
          cVar8 = cVar7;
          if ((bVar9) && ((cVar7 == '\\' || (cVar7 == '\'')))) {
            ::std::__cxx11::string::pop_back();
            cVar8 = '\0';
          }
          ::std::__cxx11::string::push_back((char)&local_78);
          uVar3 = parser->index + 1;
          parser->index = uVar3;
          if ((parser->expression)._M_string_length <= uVar3) {
            parser->reached_end = true;
          }
          if (parser->reached_end == false) {
            cVar7 = (parser->expression)._M_dataplus._M_p[uVar3];
          }
          else {
            cVar7 = '\0';
          }
        } while (cVar7 != '\0');
      }
      local_a0._0_8_ = (pointer)0x2d;
      Variant::Set((Variant *)local_a0,&local_78);
      DataParser::Emit(parser,Literal,(Variant *)local_a0);
      Variant::~Variant((Variant *)local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar6) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      DataParser::Match(parser,'\'',true);
      return;
    }
LAB_001f3dbf:
    uVar5 = (int)uVar3 - 0x30;
    out_valid_function_name = (bool *)(ulong)uVar5;
    if ((byte)uVar5 < 10) goto LAB_001f3dcb;
    if (0x19 < (byte)(((byte)uVar3 & 0xdf) + 0xbf)) {
      local_78._M_dataplus._M_p = (pointer)0x3a;
      local_a0._0_8_ = &local_90;
      local_a0._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_a0,(ulong)&local_78);
      local_90._0_8_ = local_78._M_dataplus._M_p;
      *(char *)(local_a0._0_8_ + 0x2a) = 'e';
      *(char *)(local_a0._0_8_ + 0x2b) = 'n';
      *(char *)(local_a0._0_8_ + 0x2c) = 't';
      *(char *)(local_a0._0_8_ + 0x2d) = 'h';
      *(char *)(local_a0._0_8_ + 0x2e) = 'e';
      *(char *)(local_a0._0_8_ + 0x2f) = 's';
      *(char *)(local_a0._0_8_ + 0x30) = 'i';
      *(char *)(local_a0._0_8_ + 0x31) = 's';
      *(char *)(local_a0._0_8_ + 0x32) = ',';
      *(char *)(local_a0._0_8_ + 0x33) = ' ';
      *(char *)(local_a0._0_8_ + 0x34) = 'o';
      *(char *)(local_a0._0_8_ + 0x35) = 'r';
      *(char *)(local_a0._0_8_ + 0x36) = ' ';
      *(char *)(local_a0._0_8_ + 0x37) = '\'';
      *(char *)(local_a0._0_8_ + 0x38) = '!';
      *(char *)(local_a0._0_8_ + 0x39) = '\'';
      *(char *)(local_a0._0_8_ + 0x20) = ' ';
      *(char *)(local_a0._0_8_ + 0x21) = 'n';
      *(char *)(local_a0._0_8_ + 0x22) = 'a';
      *(char *)(local_a0._0_8_ + 0x23) = 'm';
      *(char *)(local_a0._0_8_ + 0x24) = 'e';
      *(char *)(local_a0._0_8_ + 0x25) = ',';
      *(char *)(local_a0._0_8_ + 0x26) = ' ';
      *(char *)(local_a0._0_8_ + 0x27) = 'p';
      *(char *)(local_a0._0_8_ + 0x28) = 'a';
      *(char *)(local_a0._0_8_ + 0x29) = 'r';
      *(char *)(local_a0._0_8_ + 0x2a) = 'e';
      *(char *)(local_a0._0_8_ + 0x2b) = 'n';
      *(char *)(local_a0._0_8_ + 0x2c) = 't';
      *(char *)(local_a0._0_8_ + 0x2d) = 'h';
      *(char *)(local_a0._0_8_ + 0x2e) = 'e';
      *(char *)(local_a0._0_8_ + 0x2f) = 's';
      *(char *)(local_a0._0_8_ + 0x10) = 'e';
      *(char *)(local_a0._0_8_ + 0x11) = ' ';
      *(char *)(local_a0._0_8_ + 0x12) = 'n';
      *(char *)(local_a0._0_8_ + 0x13) = 'a';
      *(char *)(local_a0._0_8_ + 0x14) = 'm';
      *(char *)(local_a0._0_8_ + 0x15) = 'e';
      *(char *)(local_a0._0_8_ + 0x16) = ',';
      *(char *)(local_a0._0_8_ + 0x17) = ' ';
      *(char *)(local_a0._0_8_ + 0x18) = 'f';
      *(char *)(local_a0._0_8_ + 0x19) = 'u';
      *(char *)(local_a0._0_8_ + 0x1a) = 'n';
      *(char *)(local_a0._0_8_ + 0x1b) = 'c';
      *(char *)(local_a0._0_8_ + 0x1c) = 't';
      *(char *)(local_a0._0_8_ + 0x1d) = 'i';
      *(char *)(local_a0._0_8_ + 0x1e) = 'o';
      *(char *)(local_a0._0_8_ + 0x1f) = 'n';
      *(undefined8 *)local_a0._0_8_ = 0x2c6c61726574696c;
      *(char *)(local_a0._0_8_ + 8) = ' ';
      *(char *)(local_a0._0_8_ + 9) = 'v';
      *(char *)(local_a0._0_8_ + 10) = 'a';
      *(char *)(local_a0._0_8_ + 0xb) = 'r';
      *(char *)(local_a0._0_8_ + 0xc) = 'i';
      *(char *)(local_a0._0_8_ + 0xd) = 'a';
      *(char *)(local_a0._0_8_ + 0xe) = 'b';
      *(char *)(local_a0._0_8_ + 0xf) = 'l';
      local_a0._8_8_ = local_78._M_dataplus._M_p;
      *(char *)(local_a0._0_8_ + (long)local_78._M_dataplus._M_p) = '\0';
      DataParser::Expected(parser,(String *)local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._0_8_ == &local_90) {
        return;
      }
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
      return;
    }
    local_a1 = '\x01';
    VariableOrFunctionName_abi_cxx11_
              (&local_78,(Parse *)parser,(DataParser *)&local_a1,out_valid_function_name);
    if (local_78._M_string_length != 0) {
      iVar2 = ::std::__cxx11::string::compare((char *)&local_78);
      if (iVar2 == 0) {
        local_a0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x2d;
        Variant::Set((Variant *)local_a0,true);
        DataParser::Emit(parser,Literal,(Variant *)local_a0);
      }
      else {
        iVar2 = ::std::__cxx11::string::compare((char *)&local_78);
        if (iVar2 != 0) {
          if (parser->reached_end == false) {
            cVar7 = (parser->expression)._M_dataplus._M_p[parser->index];
            if (cVar7 == '[') {
              local_38.program_length =
                   ((long)(parser->program).
                          super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(parser->program).
                          super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
              local_38.stack_size = parser->program_stack_size;
              VariableExpression(&local_58,parser,&local_78);
              if (local_58._M_string_length == 0) {
                DataParser::AddVariableAddress(parser,&local_78);
                Variant::Variant((Variant *)local_a0);
                DataParser::Emit(parser,DynamicVariable,(Variant *)local_a0);
                Variant::~Variant((Variant *)local_a0);
              }
              else {
                DataParser::SetProgramState(parser,&local_38);
                DataParser::VariableGetSet(parser,&local_58,false);
              }
            }
            else {
              if (cVar7 != '(') goto LAB_001f4045;
              if (local_a1 != '\0') {
                Function(parser,TransformFnc,&local_78,false);
                goto LAB_001f3e1b;
              }
              ::std::operator+(&local_58,"Invalid function name \'",&local_78);
              plVar4 = (long *)::std::__cxx11::string::append((char *)&local_58);
              paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 == paVar6) {
                local_90._M_allocated_capacity = paVar6->_M_allocated_capacity;
                local_90._8_8_ = plVar4[3];
                local_a0._0_8_ = &local_90;
              }
              else {
                local_90._M_allocated_capacity = paVar6->_M_allocated_capacity;
                local_a0._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar4;
              }
              local_a0._8_8_ = plVar4[1];
              *plVar4 = (long)paVar6;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              DataParser::Error(parser,(String *)local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._0_8_ != &local_90) {
                operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) goto LAB_001f400b;
          }
          else {
LAB_001f4045:
            DataParser::VariableGetSet(parser,&local_78,false);
          }
          goto LAB_001f3e1b;
        }
        local_a0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x2d;
        Variant::Set((Variant *)local_a0,false);
        DataParser::Emit(parser,Literal,(Variant *)local_a0);
      }
      goto LAB_001f3e11;
    }
    local_a0._0_8_ = &local_90;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"Expected a variable or function name but got an empty name.","");
    DataParser::Error(parser,(String *)local_a0);
    local_58.field_2._0_8_ = local_90._0_8_;
    local_58._M_dataplus._M_p = (pointer)local_a0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._0_8_ != &local_90) {
LAB_001f400b:
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (uVar5 != 0x2d) {
      if (uVar5 == 0x28) {
        DataParser::Match(parser,'(',true);
        Expression(parser);
        DataParser::Match(parser,')',true);
        return;
      }
      goto LAB_001f3dbf;
    }
LAB_001f3dcb:
    FindNumberLiteral_abi_cxx11_
              (&local_78,(Parse *)parser,(DataParser *)0x0,SUB81(out_valid_function_name,0));
    if (local_78._M_string_length != 0) {
      value = atof(local_78._M_dataplus._M_p);
      local_a0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x2d;
      Variant::Set((Variant *)local_a0,value);
      DataParser::Emit(parser,Literal,(Variant *)local_a0);
LAB_001f3e11:
      Variant::~Variant((Variant *)local_a0);
    }
  }
LAB_001f3e1b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
LAB_001f3e79:
  DataParser::SkipWhitespace(parser);
  return;
}

Assistant:

static void Factor(DataParser& parser)
	{
		const char c = parser.Look();

		if (c == '(')
		{
			parser.Match('(');
			Expression(parser);
			parser.Match(')');
		}
		else if (c == '\'')
		{
			parser.Match('\'', false);
			StringLiteral(parser);
			parser.Match('\'');
		}
		else if (c == '!')
		{
			Not(parser);
			parser.SkipWhitespace();
		}
		else if (c == '-' || (c >= '0' && c <= '9'))
		{
			NumberLiteral(parser);
			parser.SkipWhitespace();
		}
		else if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z'))
		{
			VariableOrFunction(parser);
			parser.SkipWhitespace();
		}
		else
			parser.Expected("literal, variable name, function name, parenthesis, or '!'");
	}